

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

double Js::InterpreterStackFrame::AsmJsInterpreter<double>(AsmJsCallStackLayout *layout)

{
  ScriptFunction *function;
  FunctionBody *pFVar1;
  void *pvVar2;
  void *unaff_retaddr;
  undefined1 auStack_88 [8];
  AsmJsReturnStruct asmJsReturn;
  ArgumentReader args;
  CallInfo local_38;
  CallInfo callInfo;
  
  function = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(layout->functionObject);
  pFVar1 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  pvVar2 = FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar1,AsmJsFunctionInfo);
  if ((ulong)*(ushort *)((long)pvVar2 + 100) != 0xffff) {
    asmJsReturn.simd.field_0.i64[1] = (ulong)*(ushort *)((long)pvVar2 + 100) + 0x2000001;
    args.super_Arguments.Info = (Type)(layout + 1);
    local_38 = (CallInfo)asmJsReturn.simd.field_0.f64[1];
    ArgumentReader::AdjustArguments
              ((ArgumentReader *)((long)&asmJsReturn.simd.field_0 + 8),&local_38);
    pFVar1 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
    FunctionBody::EnsureDynamicProfileInfo(pFVar1);
    asmJsReturn.d = 0.0;
    asmJsReturn.simd.field_0.f64[0] = 0.0;
    asmJsReturn.l = 0;
    asmJsReturn.f = 0.0;
    asmJsReturn._20_4_ = 0;
    auStack_88 = (undefined1  [8])0x0;
    asmJsReturn.i = 0;
    asmJsReturn._4_4_ = 0;
    args.super_Arguments.Values = (Type)asmJsReturn.simd.field_0.f64[1];
    InterpreterHelper(function,(ArgumentReader *)&args.super_Arguments.Values,unaff_retaddr,
                      &stack0x00000000,(AsmJsReturnStruct *)auStack_88);
    return (double)asmJsReturn._16_8_;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

T InterpreterStackFrame::AsmJsInterpreter(AsmJsCallStackLayout* layout)
    {
        Js::ScriptFunction * function = Js::VarTo<Js::ScriptFunction>(layout->functionObject);
        int  flags = CallFlags_Value;
        ArgSlot nbArgs = ArgSlotMath::Add(function->GetFunctionBody()->GetAsmJsFunctionInfo()->GetArgCount(), 1);

        CallInfo callInfo((CallFlags)flags, nbArgs);
        ArgumentReader args(&callInfo, (Var*)layout->args);
        void* returnAddress = _ReturnAddress();
        void* addressOfReturnAddress = _AddressOfReturnAddress();
        function->GetFunctionBody()->EnsureDynamicProfileInfo();
        AsmJsReturnStruct asmJsReturn = { 0 };
        InterpreterHelper(function, args, returnAddress, addressOfReturnAddress, &asmJsReturn);

        return asmJsReturn.GetRetVal<T>();
    }